

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O3

bool __thiscall
Rml::DecoratorText::GenerateGeometry(DecoratorText *this,Element *element,ElementData *element_data)

{
  Texture *pTVar1;
  Texture *pTVar2;
  Colourb CVar3;
  Colourb CVar4;
  BoxArea BVar5;
  TextureFileIndex TVar6;
  StableVectorIndex SVar7;
  pointer pTVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  FontFaceHandle FVar13;
  FontEngineInterface *pFVar14;
  ComputedValues *this_00;
  undefined4 extraout_var;
  Context *this_01;
  RenderManager *mesh;
  pointer pTVar15;
  ulong uVar16;
  pointer pTVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Vector<TexturedGeometry> textured_geometry;
  TexturedMeshList mesh_list;
  undefined1 local_120 [40];
  StringView local_f8;
  TextShapingContext text_shaping_context;
  StringView local_88;
  vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
  local_78;
  RenderBox render_box;
  
  FVar13 = Element::GetFontFaceHandle(element);
  if (FVar13 == 0) {
    bVar18 = false;
  }
  else {
    pFVar14 = GetFontEngineInterface();
    iVar11 = (*pFVar14->_vptr_FontEngineInterface[0xb])(pFVar14,FVar13);
    bVar18 = true;
    if (iVar11 != element_data->font_handle_version) {
      this_00 = Element::GetComputedValues(element);
      text_shaping_context.language = &(this_00->inherited).language;
      text_shaping_context.text_direction =
           (Direction)((uint)*(undefined4 *)&(this_00->inherited).field_0x14 >> 0x1d) & (Rtl|Ltr);
      text_shaping_context.letter_spacing = Style::ComputedValues::letter_spacing(this_00);
      StringView::StringView(&local_88,&this->text);
      iVar11 = (*pFVar14->_vptr_FontEngineInterface[9])
                         (pFVar14,FVar13,local_88.p_begin,local_88.p_end,&text_shaping_context,0);
      iVar12 = (*pFVar14->_vptr_FontEngineInterface[8])(pFVar14,FVar13);
      Element::GetRenderBox(&render_box,element,element_data->paint_area,0);
      fVar20 = *(float *)(CONCAT44(extraout_var,iVar12) + 4);
      fVar21 = *(float *)(CONCAT44(extraout_var,iVar12) + 8);
      fVar19 = Element::ResolveNumericValue
                         (element,(this->align).x,render_box.fill_size.x - (float)iVar11);
      Element::ResolveNumericValue
                (element,(this->align).y,render_box.fill_size.y - (fVar21 + fVar20));
      fVar20 = (this_00->inherited).opacity;
      bVar18 = this->inherit_color;
      CVar3 = this->color;
      CVar4 = (this_00->inherited).color;
      this_01 = Element::GetContext(element);
      mesh = Context::GetRenderManager(this_01);
      mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      StringView::StringView(&local_f8,&this->text);
      if (bVar18 != false) {
        CVar3 = CVar4;
      }
      fVar20 = (float)((uint)CVar3 >> 0x18) * fVar20;
      fVar21 = fVar20 / 255.0;
      (*pFVar14->_vptr_FontEngineInterface[10])
                (fVar19 + render_box.border_widths._M_elems[3] + 0.0,pFVar14,mesh,FVar13,0,
                 local_f8.p_begin,local_f8.p_end,
                 (ulong)((int)((float)((uint)CVar3 & 0xff) * fVar21) & 0xffU |
                        ((int)((float)((uint)CVar3 >> 8 & 0xff) * fVar21) & 0xffU) << 8 |
                        (int)fVar20 << 0x18 |
                        ((int)((float)((uint)CVar3 >> 0x10 & 0xff) * fVar21) & 0xffU) << 0x10),
                 &text_shaping_context,&mesh_list);
      bVar18 = mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (bVar18) {
        ::std::
        vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ::vector(&textured_geometry,
                 (long)mesh_list.
                       super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)mesh_list.
                       super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_120);
        pTVar15 = textured_geometry.
                  super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar17 = textured_geometry.
                  super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (textured_geometry.
            super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            textured_geometry.
            super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar16 = 0;
          do {
            RenderManager::MakeGeometry((RenderManager *)local_120,(Mesh *)mesh);
            pTVar15 = textured_geometry.
                      super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar16;
            UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
            ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                                *)pTVar15);
            uVar9 = local_120._0_8_;
            local_120._0_8_ = (RenderManager *)0x0;
            (pTVar15->geometry).
            super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
            .render_manager = (RenderManager *)uVar9;
            uVar10 = local_120._8_4_;
            local_120._8_4_ = 0xffffffff;
            (pTVar15->geometry).
            super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
            .resource_handle = uVar10;
            UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
            ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                                *)local_120);
            pTVar1 = &mesh_list.
                      super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar16].texture;
            TVar6 = pTVar1->file_index;
            SVar7 = pTVar1->callback_index;
            pTVar2 = &textured_geometry.
                      super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16].texture;
            pTVar2->render_manager = pTVar1->render_manager;
            pTVar2->file_index = TVar6;
            pTVar2->callback_index = SVar7;
            uVar16 = uVar16 + 1;
            pTVar15 = textured_geometry.
                      super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pTVar17 = textured_geometry.
                      super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          } while (uVar16 < (ulong)((long)textured_geometry.
                                          super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)textured_geometry.
                                          super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        pTVar8 = textured_geometry.
                 super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        BVar5 = element_data->paint_area;
        local_120._0_4_ = BVar5;
        local_120._24_8_ =
             textured_geometry.
             super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        textured_geometry.
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        textured_geometry.
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        textured_geometry.
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_120._32_4_ = (*pFVar14->_vptr_FontEngineInterface[0xb])(pFVar14,FVar13);
        element_data->paint_area = BVar5;
        local_78.
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (element_data->textured_geometry).
             super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (element_data->textured_geometry).
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar8;
        local_78.
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (element_data->textured_geometry).
             super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_78.
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (element_data->textured_geometry).
             super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (element_data->textured_geometry).
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_start = pTVar15;
        (element_data->textured_geometry).
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTVar17;
        local_120._8_8_ = (pointer)0x0;
        local_120._16_8_ = (pointer)0x0;
        local_120._24_8_ = (pointer)0x0;
        ::std::
        vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ::~vector(&local_78);
        element_data->font_handle_version = local_120._32_4_;
        ::std::
        vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ::~vector((vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                   *)(local_120 + 8));
        ::std::
        vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ::~vector(&textured_geometry);
      }
      ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::~vector(&mesh_list);
    }
  }
  return bVar18;
}

Assistant:

bool DecoratorText::GenerateGeometry(Element* element, ElementData& element_data) const
{
	FontFaceHandle font_face_handle = element->GetFontFaceHandle();
	if (font_face_handle == 0)
		return false;

	FontEngineInterface* font_engine_interface = GetFontEngineInterface();
	const int new_version = font_engine_interface->GetVersion(font_face_handle);
	if (new_version == element_data.font_handle_version)
		return true;

	const auto& computed = element->GetComputedValues();
	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};

	const int string_width = font_engine_interface->GetStringWidth(font_face_handle, text, text_shaping_context);

	const FontMetrics& metrics = font_engine_interface->GetFontMetrics(font_face_handle);
	const RenderBox render_box = element->GetRenderBox(element_data.paint_area);
	const Vector2f text_size = {float(string_width), metrics.ascent + metrics.descent};
	const Vector2f offset_to_align_area = render_box.GetFillOffset() + Vector2f{0, metrics.ascent};
	const Vector2f size_of_align_area = render_box.GetFillSize() - text_size;
	const Vector2f offset_within_align_area =
		Vector2f{element->ResolveNumericValue(align.x, size_of_align_area.x), element->ResolveNumericValue(align.y, size_of_align_area.y)};

	const Vector2f offset = offset_to_align_area + offset_within_align_area;
	const float opacity = computed.opacity();
	const ColourbPremultiplied text_color = (inherit_color ? computed.color() : color).ToPremultiplied(opacity);

	RenderManager& render_manager = element->GetContext()->GetRenderManager();
	TexturedMeshList mesh_list;
	font_engine_interface->GenerateString(render_manager, font_face_handle, {}, text, offset, text_color, opacity, text_shaping_context, mesh_list);

	if (mesh_list.empty())
		return false;

	Vector<TexturedGeometry> textured_geometry(mesh_list.size());
	for (size_t i = 0; i < textured_geometry.size(); i++)
	{
		textured_geometry[i].geometry = render_manager.MakeGeometry(std::move(mesh_list[i].mesh));
		textured_geometry[i].texture = mesh_list[i].texture;
	}

	element_data = ElementData{
		element_data.paint_area,
		std::move(textured_geometry),
		font_engine_interface->GetVersion(font_face_handle),
	};

	return true;
}